

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_zdd.c
# Opt level: O0

ZDD zdd_cover_enum_first(ZDD dd,int32_t *arr)

{
  uint32_t uVar1;
  zddnode_t n;
  ZDD dd_00;
  ZDD res;
  uint32_t dd_var;
  zddnode_t dd_node;
  int32_t *arr_local;
  ZDD dd_local;
  
  if (dd == 0) {
    dd_local = 0;
  }
  else if (dd == 0x8000000000000000) {
    *arr = -1;
    dd_local = 0x8000000000000000;
  }
  else {
    n = ZDD_GETNODE(dd);
    uVar1 = zddnode_getvariable(n);
    dd_00 = zddnode_high(dd,n);
    dd_local = zdd_cover_enum_first(dd_00,arr + 1);
    if (dd_local == 0) {
      __assert_fail("res != zdd_false",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_zdd.c"
                    ,0x921,"ZDD zdd_cover_enum_first(ZDD, int32_t *)");
    }
    *arr = uVar1;
  }
  return dd_local;
}

Assistant:

ZDD
zdd_cover_enum_first(ZDD dd, int32_t *arr)
{
    if (dd == zdd_false) {
        return zdd_false;
    } else if (dd == zdd_true) {
        *arr = -1;
        return zdd_true;
    } else {
        const zddnode_t dd_node = ZDD_GETNODE(dd);
        const uint32_t dd_var = zddnode_getvariable(dd_node);

        ZDD res = zdd_cover_enum_first(zddnode_high(dd, dd_node), arr+1);
        // this cannot return False; following high edges must always lead to zdd_true!
        assert(res != zdd_false);

        *arr = dd_var;
        return res;
    }
}